

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlCreatePushParser(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  PyObject *pyret;
  xmlParserCtxtPtr ret;
  xmlSAXHandlerPtr SAX;
  PyObject *pyobj_SAX;
  char *URI;
  undefined8 uStack_28;
  int size;
  char *chunk;
  PyObject *args_local;
  PyObject *self_local;
  
  SAX = (xmlSAXHandlerPtr)0x0;
  ret = (xmlParserCtxtPtr)0x0;
  chunk = (char *)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"Oziz:xmlCreatePushParser",&SAX,&stack0xffffffffffffffd8,(long)&URI + 4,
                     &pyobj_SAX);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (SAX != (xmlSAXHandlerPtr)&_Py_NoneStruct) {
      ret = (xmlParserCtxtPtr)&pythonSaxHandler;
      _Py_INCREF((PyObject *)SAX);
    }
    ctxt = (xmlParserCtxtPtr)xmlCreatePushParserCtxt(ret,SAX,uStack_28,URI._4_4_,pyobj_SAX);
    self_local = libxml_xmlParserCtxtPtrWrap(ctxt);
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlCreatePushParser(ATTRIBUTE_UNUSED PyObject * self,
                           PyObject * args)
{
    const char *chunk;
    int size;
    const char *URI;
    PyObject *pyobj_SAX = NULL;
    xmlSAXHandlerPtr SAX = NULL;
    xmlParserCtxtPtr ret;
    PyObject *pyret;

    if (!PyArg_ParseTuple
        (args, (char *) "Oziz:xmlCreatePushParser", &pyobj_SAX, &chunk,
         &size, &URI))
        return (NULL);

#ifdef DEBUG
    printf("libxml_xmlCreatePushParser(%p, %s, %d, %s) called\n",
           pyobj_SAX, chunk, size, URI);
#endif
    if (pyobj_SAX != Py_None) {
        SAX = &pythonSaxHandler;
        Py_INCREF(pyobj_SAX);
        /* The reference is released in pythonEndDocument() */
    }
    ret = xmlCreatePushParserCtxt(SAX, pyobj_SAX, chunk, size, URI);
    pyret = libxml_xmlParserCtxtPtrWrap(ret);
    return (pyret);
}